

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O1

void __thiscall rtosc::UndoHistoryImpl::clear(UndoHistoryImpl *this)

{
  _Elt_pointer ppVar1;
  deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_> *__range1;
  _Map_pointer pppVar2;
  _Elt_pointer ppVar3;
  _Elt_pointer ppVar4;
  
  ppVar4 = (this->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVar1 = (this->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar4 != ppVar1) {
    ppVar3 = (this->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    pppVar2 = (this->history).
              super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if (ppVar4->second != (char *)0x0) {
        operator_delete__(ppVar4->second);
      }
      ppVar4 = ppVar4 + 1;
      if (ppVar4 == ppVar3) {
        ppVar4 = pppVar2[1];
        pppVar2 = pppVar2 + 1;
        ppVar3 = ppVar4 + 0x20;
      }
    } while (ppVar4 != ppVar1);
  }
  std::deque<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>::clear
            (&this->history);
  this->history_pos = 0;
  return;
}

Assistant:

void UndoHistoryImpl::clear(void)
{
    for(auto elm : history)
        delete [] elm.second;
    history.clear();
    history_pos = 0;
}